

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_get(Table *t,TValue *key)

{
  int *piVar1;
  int iVar2;
  TValue *pTVar3;
  byte bVar4;
  Node *pNVar5;
  lua_Integer k;
  lua_Integer local_20;
  
  bVar4 = key->tt_ & 0x3f;
  if (bVar4 < 4) {
    if ((key->tt_ & 0x3f) == 0) {
      return &absentkey;
    }
    if (bVar4 == 3) {
      pTVar3 = luaH_getint(t,(key->value_).i);
      return pTVar3;
    }
  }
  else if (bVar4 == 0x13) {
    iVar2 = luaV_flttointeger((key->value_).n,&local_20,F2Ieq);
    if (iVar2 != 0) {
      pTVar3 = luaH_getint(t,local_20);
      return pTVar3;
    }
  }
  else if (bVar4 == 4) {
    pNVar5 = t->node + (~(-1 << (t->lsizenode & 0x1f)) &
                       *(uint *)&((GCObject *)(key->value_).f)->field_0xc);
    while (((pNVar5->u).key_tt != 'D' || ((pNVar5->u).key_val.gc != (GCObject *)(key->value_).f))) {
      piVar1 = &(pNVar5->u).next;
      pNVar5 = pNVar5 + *piVar1;
      if ((long)*piVar1 == 0) {
        return &absentkey;
      }
    }
    return (TValue *)pNVar5;
  }
  pTVar3 = getgeneric(t,key,0);
  return pTVar3;
}

Assistant:

const TValue *luaH_get (Table *t, const TValue *key) {
  switch (ttypetag(key)) {
    case LUA_VSHRSTR: return luaH_getshortstr(t, tsvalue(key));
    case LUA_VNUMINT: return luaH_getint(t, ivalue(key));
    case LUA_VNIL: return &absentkey;
    case LUA_VNUMFLT: {
      lua_Integer k;
      if (luaV_flttointeger(fltvalue(key), &k, F2Ieq)) /* integral index? */
        return luaH_getint(t, k);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      return getgeneric(t, key, 0);
  }
}